

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

Clause * __thiscall LinearGE<0,_1>::explain(LinearGE<0,_1> *this,Lit param_1,int inf_id)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Lit *pLVar4;
  int iVar5;
  Clause *this_00;
  size_t __size;
  int iVar6;
  ulong uVar7;
  long lVar8;
  Clause *c;
  Clause *local_38;
  
  uVar1 = (this->x).sz;
  uVar2 = (this->y).sz;
  uVar3 = (this->r).v;
  if (sat.assigns.data[uVar3] != 0) {
    ((this->ps).data)->x = (uint)((byte)sat.assigns.data[uVar3] < 0xfe) + uVar3 * 2;
  }
  if ((this->x).sz != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      iVar5 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar8) + 0x48))();
      (this->ps).data[uVar7 + 1].x = iVar5;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (this->x).sz);
  }
  if ((this->y).sz != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      iVar5 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar8) + 0x40))();
      iVar6 = (int)uVar7;
      uVar7 = uVar7 + 1;
      (this->ps).data[(this->x).sz + iVar6 + 1].x = iVar5;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (this->y).sz);
  }
  pLVar4 = (this->ps).data;
  uVar7 = (ulong)(inf_id + 1);
  if (uVar2 + uVar1 == inf_id) {
    uVar7 = 0;
  }
  pLVar4[uVar7].x = pLVar4->x;
  uVar1 = (this->ps).sz;
  __size = 8;
  if (uVar1 != 0) {
    __size = (ulong)(uVar1 - 1) * 4 + 8;
  }
  this_00 = (Clause *)malloc(__size);
  Clause::Clause<vec<Lit>>(this_00,&this->ps,false);
  *(byte *)this_00 = *(byte *)this_00 | 2;
  local_38 = this_00;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  return local_38;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}